

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::Clamp(Bignum *this)

{
  uint *puVar1;
  int iVar2;
  
  iVar2 = this->used_digits_;
  while (0 < iVar2) {
    puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,iVar2 + -1);
    iVar2 = this->used_digits_;
    if (*puVar1 != 0) break;
    iVar2 = iVar2 + -1;
    this->used_digits_ = iVar2;
  }
  if (iVar2 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::Clamp() {
  while (used_digits_ > 0 && bigits_[used_digits_ - 1] == 0) {
    used_digits_--;
  }
  if (used_digits_ == 0) {
    // Zero.
    exponent_ = 0;
  }
}